

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTSDA.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkTSDA::Initialize
          (ChLinkTSDA *this,shared_ptr<chrono::ChBody> *body1,shared_ptr<chrono::ChBody> *body2,
          bool pos_are_relative,ChVector<double> *loc1,ChVector<double> *loc2)

{
  element_type *peVar1;
  element_type *peVar2;
  double dVar3;
  undefined7 in_register_00000009;
  ChBodyFrame *pCVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double local_48;
  double dStack_40;
  double local_38;
  
  peVar1 = (body1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar4 = &peVar1->super_ChBodyFrame;
  if (peVar1 == (element_type *)0x0) {
    pCVar4 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body1 = pCVar4;
  peVar2 = (body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar4 = &peVar2->super_ChBodyFrame;
  if (peVar2 == (element_type *)0x0) {
    pCVar4 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body2 = pCVar4;
  if ((int)CONCAT71(in_register_00000009,pos_are_relative) == 0) {
    ChTransform<double>::TransformParentToLocal
              (loc1,&(peVar1->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                     coord.pos,
               &(peVar1->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                Amatrix);
    if ((ChVector<double> *)&local_48 != &this->m_loc1) {
      (this->m_loc1).m_data[0] = local_48;
      (this->m_loc1).m_data[1] = dStack_40;
      (this->m_loc1).m_data[2] = local_38;
    }
    peVar1 = (body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ChTransform<double>::TransformParentToLocal
              (loc2,&(peVar1->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                     coord.pos,
               &(peVar1->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                Amatrix);
    if ((ChVector<double> *)&local_48 != &this->m_loc2) {
      (this->m_loc2).m_data[0] = local_48;
      (this->m_loc2).m_data[1] = dStack_40;
      (this->m_loc2).m_data[2] = local_38;
    }
    if (&this->m_aloc1 != loc1) {
      (this->m_aloc1).m_data[0] = loc1->m_data[0];
      (this->m_aloc1).m_data[1] = loc1->m_data[1];
      (this->m_aloc1).m_data[2] = loc1->m_data[2];
    }
    if (&this->m_aloc2 == loc2) goto LAB_0059af30;
    (this->m_aloc2).m_data[0] = loc2->m_data[0];
    (this->m_aloc2).m_data[1] = loc2->m_data[1];
    local_38 = loc2->m_data[2];
  }
  else {
    if (&this->m_loc1 != loc1) {
      (this->m_loc1).m_data[0] = loc1->m_data[0];
      (this->m_loc1).m_data[1] = loc1->m_data[1];
      (this->m_loc1).m_data[2] = loc1->m_data[2];
    }
    if (&this->m_loc2 != loc2) {
      (this->m_loc2).m_data[0] = loc2->m_data[0];
      (this->m_loc2).m_data[1] = loc2->m_data[1];
      (this->m_loc2).m_data[2] = loc2->m_data[2];
    }
    ChTransform<double>::TransformLocalToParent
              (loc1,&(peVar1->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                     coord.pos,
               &(peVar1->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                Amatrix);
    if ((ChVector<double> *)&local_48 != &this->m_aloc1) {
      (this->m_aloc1).m_data[0] = local_48;
      (this->m_aloc1).m_data[1] = dStack_40;
      (this->m_aloc1).m_data[2] = local_38;
    }
    peVar1 = (body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ChTransform<double>::TransformLocalToParent
              (loc2,&(peVar1->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                     coord.pos,
               &(peVar1->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                Amatrix);
    if ((ChVector<double> *)&local_48 == &this->m_aloc2) goto LAB_0059af30;
    (this->m_aloc2).m_data[0] = local_48;
    (this->m_aloc2).m_data[1] = dStack_40;
  }
  (this->m_aloc2).m_data[2] = local_38;
LAB_0059af30:
  dVar3 = (this->m_aloc1).m_data[1] - (this->m_aloc2).m_data[1];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (this->m_aloc1).m_data[0] - (this->m_aloc2).m_data[0];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar3 * dVar3;
  auVar5 = vfmadd231sd_fma(auVar6,auVar5,auVar5);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (this->m_aloc1).m_data[2] - (this->m_aloc2).m_data[2];
  auVar5 = vfmadd231sd_fma(auVar5,auVar7,auVar7);
  auVar5 = vsqrtsd_avx(auVar5,auVar5);
  this->m_length = auVar5._0_8_;
  if (this->m_auto_rest_length == true) {
    this->m_rest_length = auVar5._0_8_;
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->m_Qforce).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)this->m_nstates + 0xc);
  return;
}

Assistant:

void ChLinkTSDA::Initialize(std::shared_ptr<ChBody> body1,
                            std::shared_ptr<ChBody> body2,
                            bool pos_are_relative,
                            ChVector<> loc1,
                            ChVector<> loc2) {
    Body1 = (ChBodyFrame*)body1.get();
    Body2 = (ChBodyFrame*)body2.get();

    if (pos_are_relative) {
        m_loc1 = loc1;
        m_loc2 = loc2;
        m_aloc1 = body1->TransformPointLocalToParent(loc1);
        m_aloc2 = body2->TransformPointLocalToParent(loc2);
    } else {
        m_loc1 = body1->TransformPointParentToLocal(loc1);
        m_loc2 = body2->TransformPointParentToLocal(loc2);
        m_aloc1 = loc1;
        m_aloc2 = loc2;
    }

    m_length = (m_aloc1 - m_aloc2).Length();
    if (m_auto_rest_length)
        m_rest_length = m_length;

    // Set size of forcing term
    m_Qforce.resize(12 + m_nstates);
}